

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O0

void lws_x509_destroy(lws_x509_cert **x509)

{
  lws_x509_cert **x509_local;
  
  if (*x509 != (lws_x509_cert *)0x0) {
    if ((*x509)->cert != (X509 *)0x0) {
      X509_free((X509 *)(*x509)->cert);
      (*x509)->cert = (X509 *)0x0;
    }
    lws_realloc(*x509,0,"free");
    *x509 = (lws_x509_cert *)0x0;
  }
  return;
}

Assistant:

void
lws_x509_destroy(struct lws_x509_cert **x509)
{
	if (!*x509)
		return;

	if ((*x509)->cert) {
		X509_free((*x509)->cert);
		(*x509)->cert = NULL;
	}

	lws_free_set_NULL(*x509);
}